

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  mapped_type *pmVar1;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  mapped_type *local_18;
  cmSearchPath *paths;
  cmFindPackageCommand *this_local;
  
  paths = (cmSearchPath *)this;
  pmVar1 = std::
           map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
           ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                        &cmFindCommon::PathLabel::CMakeSystem);
  local_18 = pmVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SYSTEM_PREFIX_PATH",&local_39);
  cmSearchPath::AddCMakePath(pmVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pmVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_SYSTEM_FRAMEWORK_PATH",&local_71);
  cmSearchPath::AddCMakePath(pmVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pmVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"CMAKE_SYSTEM_APPBUNDLE_PATH",&local_99);
  cmSearchPath::AddCMakePath(pmVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");
}